

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

void history_def_delete(history_t *h,HistEvent_conflict *ev,hentry_t_conflict *hp)

{
  history_t *phVar1;
  hentry_t_conflict *phVar2;
  
  if ((history_t *)ev != h) {
    phVar1 = *(history_t **)(ev + 2);
    if ((h->cursor == (hentry_t_conflict *)ev) && (h->cursor = &phVar1->list, phVar1 == h)) {
      h->cursor = (hentry_t_conflict *)ev[1].str;
    }
    phVar2 = (hentry_t_conflict *)ev[1].str;
    (phVar1->list).next = phVar2;
    phVar2->prev = &phVar1->list;
    free(ev->str);
    free(ev);
    h->cur = h->cur + -1;
    return;
  }
  abort();
}

Assistant:

static void
history_def_delete(history_t *h,
		   TYPE(HistEvent) *ev __attribute__((__unused__)), hentry_t *hp)
{
	HistEventPrivate *evp = (void *)&hp->ev;
	if (hp == &h->list)
		abort();
	if (h->cursor == hp) {
		h->cursor = hp->prev;
		if (h->cursor == &h->list)
			h->cursor = hp->next;
	}
	hp->prev->next = hp->next;
	hp->next->prev = hp->prev;
	h_free(evp->str);
	h_free(hp);
	h->cur--;
}